

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode
JsVarDeserializerReadRawBytes(JsVarDeserializerHandle deserializerHandle,size_t length,void **data)

{
  bool bVar1;
  JsErrorCode JVar2;
  JsrtContext *currentContext;
  ChakraHostDeserializerHandle *deserializer;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar2 = JsErrorNullArgument;
  if (data != (void **)0x0 && deserializerHandle != (JsVarDeserializerHandle)0x0) {
    currentContext = JsrtContext::GetCurrent();
    JVar2 = CheckContext(currentContext,false,false);
    if (JVar2 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      bVar1 = ChakraHostDeserializerHandle::ReadRawBytes
                        ((ChakraHostDeserializerHandle *)deserializerHandle,length,data);
      JVar2 = JsErrorInvalidArgument;
      if (bVar1) {
        JVar2 = JsNoError;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API
JsVarDeserializerReadRawBytes(_In_ JsVarDeserializerHandle deserializerHandle, _In_ size_t length, _Out_ void **data)
{
    PARAM_NOT_NULL(deserializerHandle);
    PARAM_NOT_NULL(data);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraHostDeserializerHandle* deserializer = reinterpret_cast<ChakraHostDeserializerHandle*>(deserializerHandle);
        if (!deserializer->ReadRawBytes(length, data))
        {
            return JsErrorInvalidArgument;
        }
        return JsNoError;
    });
}